

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIntegrable.cpp
# Opt level: O3

void __thiscall
chrono::ChIntegrableIIorder::StateIncrement
          (ChIntegrableIIorder *this,ChState *y_new,ChState *y,ChStateDelta *Dy)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  Index size_1;
  ChException *this_00;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  Index size;
  ChStateDelta mv_new;
  ChState mx_new;
  ChStateDelta mDv;
  ChStateDelta mDx;
  ChStateDelta mv;
  ChState mx;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_130;
  long local_100;
  ChStateDelta local_f8;
  ChStateDelta local_e0;
  ChState local_c8;
  ChStateDelta local_b0;
  ChStateDelta local_98;
  ChStateDelta local_80;
  ChState local_68;
  string local_50;
  
  lVar17 = (y->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])();
  if (lVar17 == iVar11) {
    (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x1b])(this,y_new,y,Dy);
    return;
  }
  lVar17 = (y->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  iVar11 = (**(this->super_ChIntegrable)._vptr_ChIntegrable)(this);
  if (lVar17 != iVar11) {
    this_00 = (ChException *)__cxa_allocate_exception(0x28);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"StateIncrement() called with a wrong number of elements","");
    ChException::ChException(this_00,&local_50);
    __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
  }
  iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
  ChState::ChState(&local_68,(long)iVar11,y->integrable);
  iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  ChStateDelta::ChStateDelta(&local_80,(long)iVar11,y->integrable);
  iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
  local_130.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_data = (y->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  lVar17 = (y->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_130.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_rows.m_value = (long)iVar11;
  if (iVar11 < 0 &&
      local_130.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_data != (double *)0x0) {
LAB_0086f9dc:
    pcVar16 = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
    ;
LAB_0086fad9:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar16);
  }
  local_130.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  local_130.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)y;
  local_100 = lVar17;
  if ((-1 < iVar11) &&
     (local_130.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_rows.m_value <= lVar17)) {
    ChState::operator=(&local_68,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                        *)&local_130);
    uVar12 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
    uVar13 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
    pdVar3 = (y->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    lVar17 = (y->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    lVar14 = (long)(int)uVar12;
    local_130.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
    .m_rows.m_value = (long)(int)uVar13;
    local_130.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
    .m_data = pdVar3 + lVar14;
    if ((int)uVar13 < 0 && pdVar3 != (double *)0x0) goto LAB_0086f9dc;
    local_130.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)y;
    local_130.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = lVar14;
    local_100 = lVar17;
    if ((-1 < (int)(uVar13 | uVar12)) &&
       (lVar14 <= lVar17 - local_130.
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                           .
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                           .m_rows.m_value)) {
      ChStateDelta::operator=
                (&local_80,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_130);
      iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
      ChStateDelta::ChStateDelta(&local_98,(long)iVar11,y->integrable);
      iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x14])(this);
      ChStateDelta::ChStateDelta(&local_b0,(long)iVar11,y->integrable);
      iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
      local_130.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_data = (Dy->super_ChVectorDynamic<double>).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      lVar17 = (Dy->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_130.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_rows.m_value = (long)iVar11;
      if (iVar11 < 0 &&
          local_130.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_data != (double *)0x0) goto LAB_0086f9dc;
      local_130.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows = 0;
      local_130.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = (double *)Dy;
      local_100 = lVar17;
      if ((-1 < iVar11) &&
         (local_130.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value <= lVar17)) {
        ChStateDelta::operator=
                  (&local_98,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_130);
        uVar12 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
        uVar13 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x14])(this);
        pdVar3 = (Dy->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        lVar17 = (Dy->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        lVar14 = (long)(int)uVar12;
        local_130.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
        .m_rows.m_value = (long)(int)uVar13;
        local_130.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
        .m_data = pdVar3 + lVar14;
        if ((int)uVar13 < 0 && pdVar3 != (double *)0x0) goto LAB_0086f9dc;
        local_130.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data = (double *)Dy;
        local_130.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows = lVar14;
        local_100 = lVar17;
        if ((-1 < (int)(uVar13 | uVar12)) &&
           (lVar14 <= lVar17 - local_130.
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                               .
                               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                               .m_rows.m_value)) {
          ChStateDelta::operator=
                    (&local_b0,
                     (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_130);
          iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
          ChState::ChState(&local_c8,(long)iVar11,y->integrable);
          iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
          ChStateDelta::ChStateDelta(&local_f8,(long)iVar11,y->integrable);
          (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x1b])(this,&local_c8,&local_68,&local_98)
          ;
          local_130.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_data = (double *)0x0;
          local_130.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows = 0;
          local_130.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_data = local_b0.super_ChVectorDynamic<double>.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          local_130.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value =
               local_b0.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          if (local_b0.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0 &&
              local_b0.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            pcVar16 = 
            "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
            ;
            goto LAB_0086fad9;
          }
          ChStateDelta::operator+(&local_e0,&local_80,&local_130);
          pdVar3 = local_e0.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          if ((local_f8.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
               local_e0.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) &&
             (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_f8,
                         local_e0.super_ChVectorDynamic<double>.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows,1),
             local_f8.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
             local_e0.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)) {
            __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                         );
          }
          uVar15 = local_e0.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
                   7;
          if (-1 < local_e0.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            uVar15 = local_e0.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            ;
          }
          uVar15 = uVar15 & 0xfffffffffffffff8;
          if (7 < local_e0.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            lVar17 = 0;
            do {
              pdVar1 = pdVar3 + lVar17;
              dVar4 = pdVar1[1];
              dVar5 = pdVar1[2];
              dVar6 = pdVar1[3];
              dVar7 = pdVar1[4];
              dVar8 = pdVar1[5];
              dVar9 = pdVar1[6];
              dVar10 = pdVar1[7];
              pdVar2 = local_f8.super_ChVectorDynamic<double>.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data + lVar17;
              *pdVar2 = *pdVar1;
              pdVar2[1] = dVar4;
              pdVar2[2] = dVar5;
              pdVar2[3] = dVar6;
              pdVar2[4] = dVar7;
              pdVar2[5] = dVar8;
              pdVar2[6] = dVar9;
              pdVar2[7] = dVar10;
              lVar17 = lVar17 + 8;
            } while (lVar17 < (long)uVar15);
          }
          if ((long)uVar15 <
              local_e0.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            do {
              local_f8.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar15] = pdVar3[uVar15];
              uVar15 = uVar15 + 1;
            } while (local_e0.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                     != uVar15);
          }
          local_f8.integrable = local_e0.integrable;
          if (local_e0.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)local_e0.super_ChVectorDynamic<double>.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          if ((ChStateDelta *)
              local_130.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data != (ChStateDelta *)0x0) {
            free(((ChStateDelta *)
                 ((long)local_130.m_object.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data + -0x18))->integrable);
          }
          iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
          pdVar3 = (y_new->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          if (-1 < iVar11 || pdVar3 == (double *)0x0) {
            if ((-1 < iVar11) &&
               (uVar15 = (ulong)iVar11,
               (long)uVar15 <=
               (y_new->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)) {
              if (local_c8.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                  uVar15) {
LAB_0086fa46:
                __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                              ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                              "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                             );
              }
              uVar18 = uVar15;
              if ((((ulong)pdVar3 & 7) == 0) &&
                 (uVar18 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7), uVar15 <= uVar18
                 )) {
                uVar18 = uVar15;
              }
              iVar11 = (int)(uVar15 - uVar18);
              iVar19 = iVar11 + 7;
              if (-1 < iVar11) {
                iVar19 = iVar11;
              }
              if (uVar18 != 0) {
                uVar21 = 0;
                do {
                  pdVar3[uVar21] =
                       local_c8.super_ChVectorDynamic<double>.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar18 != uVar21);
              }
              uVar21 = uVar18 + (long)(iVar19 >> 3) * 8;
              if (7 < (long)(uVar15 - uVar18)) {
                do {
                  pdVar1 = local_c8.super_ChVectorDynamic<double>.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data + uVar18;
                  dVar4 = pdVar1[1];
                  dVar5 = pdVar1[2];
                  dVar6 = pdVar1[3];
                  dVar7 = pdVar1[4];
                  dVar8 = pdVar1[5];
                  dVar9 = pdVar1[6];
                  dVar10 = pdVar1[7];
                  pdVar2 = pdVar3 + uVar18;
                  *pdVar2 = *pdVar1;
                  pdVar2[1] = dVar4;
                  pdVar2[2] = dVar5;
                  pdVar2[3] = dVar6;
                  pdVar2[4] = dVar7;
                  pdVar2[5] = dVar8;
                  pdVar2[6] = dVar9;
                  pdVar2[7] = dVar10;
                  uVar18 = uVar18 + 8;
                } while ((long)uVar18 < (long)uVar21);
              }
              if ((long)uVar21 < (long)uVar15) {
                do {
                  pdVar3[uVar21] =
                       local_c8.super_ChVectorDynamic<double>.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar15 != uVar21);
              }
              uVar12 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
              uVar13 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
              pdVar3 = (y_new->super_ChVectorDynamic<double>).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
              if ((int)uVar13 < 0 && pdVar3 != (double *)0x0) goto LAB_0086fa0d;
              uVar15 = (ulong)(int)uVar13;
              if ((-1 < (int)(uVar13 | uVar12)) &&
                 ((long)(int)uVar12 <=
                  (long)((y_new->super_ChVectorDynamic<double>).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows - uVar15))) {
                if (local_f8.super_ChVectorDynamic<double>.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                    != uVar15) goto LAB_0086fa46;
                pdVar3 = pdVar3 + (int)uVar12;
                uVar18 = uVar15;
                if ((((ulong)pdVar3 & 7) == 0) &&
                   (uVar18 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7),
                   (long)uVar15 <= (long)uVar18)) {
                  uVar18 = uVar15;
                }
                uVar20 = uVar15 - uVar18;
                uVar21 = uVar20 + 7;
                if (-1 < (long)uVar20) {
                  uVar21 = uVar20;
                }
                if (0 < (long)uVar18) {
                  uVar22 = 0;
                  do {
                    pdVar3[uVar22] =
                         local_f8.super_ChVectorDynamic<double>.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar22];
                    uVar22 = uVar22 + 1;
                  } while (uVar18 != uVar22);
                }
                uVar21 = (uVar21 & 0xfffffffffffffff8) + uVar18;
                if (7 < (long)uVar20) {
                  do {
                    pdVar1 = local_f8.super_ChVectorDynamic<double>.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data + uVar18;
                    dVar4 = pdVar1[1];
                    dVar5 = pdVar1[2];
                    dVar6 = pdVar1[3];
                    dVar7 = pdVar1[4];
                    dVar8 = pdVar1[5];
                    dVar9 = pdVar1[6];
                    dVar10 = pdVar1[7];
                    pdVar2 = pdVar3 + uVar18;
                    *pdVar2 = *pdVar1;
                    pdVar2[1] = dVar4;
                    pdVar2[2] = dVar5;
                    pdVar2[3] = dVar6;
                    pdVar2[4] = dVar7;
                    pdVar2[5] = dVar8;
                    pdVar2[6] = dVar9;
                    pdVar2[7] = dVar10;
                    uVar18 = uVar18 + 8;
                  } while ((long)uVar18 < (long)uVar21);
                }
                if ((long)uVar21 < (long)uVar15) {
                  do {
                    pdVar3[uVar21] =
                         local_f8.super_ChVectorDynamic<double>.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar21];
                    uVar21 = uVar21 + 1;
                  } while (uVar15 != uVar21);
                }
                else if (local_f8.super_ChVectorDynamic<double>.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data == (double *)0x0) goto LAB_0086f94d;
                free((void *)local_f8.super_ChVectorDynamic<double>.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[-1]);
LAB_0086f94d:
                if (local_c8.super_ChVectorDynamic<double>.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    != (double *)0x0) {
                  free((void *)local_c8.super_ChVectorDynamic<double>.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data[-1]);
                }
                if (local_b0.super_ChVectorDynamic<double>.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    != (double *)0x0) {
                  free((void *)local_b0.super_ChVectorDynamic<double>.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data[-1]);
                }
                if (local_98.super_ChVectorDynamic<double>.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    != (double *)0x0) {
                  free((void *)local_98.super_ChVectorDynamic<double>.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data[-1]);
                }
                if (local_80.super_ChVectorDynamic<double>.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    != (double *)0x0) {
                  free((void *)local_80.super_ChVectorDynamic<double>.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data[-1]);
                }
                if (local_68.super_ChVectorDynamic<double>.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    != (double *)0x0) {
                  free((void *)local_68.super_ChVectorDynamic<double>.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data[-1]);
                }
                return;
              }
            }
            pcVar16 = 
            "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
            ;
            goto LAB_0086fa3c;
          }
LAB_0086fa0d:
          pcVar16 = 
          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
          ;
          goto LAB_0086fad9;
        }
      }
    }
  }
  pcVar16 = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0086fa3c:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,pcVar16);
}

Assistant:

void ChIntegrableIIorder::StateIncrement(ChState& y_new,         // resulting y_new = y + Dy
                                         const ChState& y,       // initial state y
                                         const ChStateDelta& Dy  // state increment Dy
                                         ) {
    if (y.size() == GetNcoords_x()) {
        // Incrementing the x part only, user provided only x  in y={x, dx/dt}
        StateIncrementX(y_new, y, Dy);

        return;
    }

    if (y.size() == GetNcoords_y()) {
        // Incrementing y in y={x, dx/dt}.
        // PERFORMANCE WARNING! temporary vectors allocated on heap.
        // This is only to support compatibility with 1st order integrators.
        ChState mx(GetNcoords_x(), y.GetIntegrable());
        ChStateDelta mv(GetNcoords_v(), y.GetIntegrable());
        mx = y.segment(0, GetNcoords_x());
        mv = y.segment(GetNcoords_x(), GetNcoords_v());

        ChStateDelta mDx(GetNcoords_v(), y.GetIntegrable());
        ChStateDelta mDv(GetNcoords_a(), y.GetIntegrable());
        mDx = Dy.segment(0, GetNcoords_v());
        mDv = Dy.segment(GetNcoords_v(), GetNcoords_a());
        
        ChState mx_new(GetNcoords_x(), y.GetIntegrable());
        ChStateDelta mv_new(GetNcoords_v(), y.GetIntegrable());
        StateIncrementX(mx_new, mx, mDx);  // increment positions
        mv_new = mv + mDv;                 // increment speeds

        y_new.segment(0, GetNcoords_x()) = mx_new;
        y_new.segment(GetNcoords_x(), GetNcoords_v()) = mv_new;
    
        return;
    }

    throw ChException("StateIncrement() called with a wrong number of elements");
}